

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O1

void amrex::readBoxArray(BoxArray *ba,istream *is,bool bReadSpecial)

{
  istream *this;
  ulong *puVar1;
  undefined7 in_register_00000011;
  int i;
  int maxbox;
  Box b;
  ULong in_hash;
  int local_58;
  Box local_54;
  
  if ((int)CONCAT71(in_register_00000011,bReadSpecial) != 0) {
    this = (istream *)std::istream::ignore((long)is,100000);
    puVar1 = (ulong *)std::istream::operator>>(this,&local_58);
    std::istream::_M_extract<unsigned_long>(puVar1);
    BoxArray::resize(ba,(long)local_58);
    if (0 < local_58) {
      i = 0;
      do {
        local_54.smallend.vect[0] = 1;
        local_54.smallend.vect[1] = 1;
        local_54.smallend.vect[2] = 1;
        local_54.bigend.vect[0] = 0;
        local_54.bigend.vect[1] = 0;
        local_54.bigend.vect[2] = 0;
        local_54.btype.itype = 0;
        operator>>(is,&local_54);
        BoxArray::set(ba,i,&local_54);
        i = i + 1;
      } while (i < local_58);
    }
    std::istream::ignore((long)is,100000);
    if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
      Error_host("readBoxArray(BoxArray&,istream&,int) failed");
    }
    return;
  }
  BoxArray::readFrom(ba,is);
  return;
}

Assistant:

void
readBoxArray (BoxArray&     ba,
              std::istream& is,
              bool          bReadSpecial)
{
    if (bReadSpecial == false)
    {
        ba.readFrom(is);
    }
    else
    {
        BL_ASSERT(ba.size() == 0);
        int maxbox;
        ULong in_hash; // will be ignored
        is.ignore(bl_ignore_max, '(') >> maxbox >> in_hash;
        ba.resize(maxbox);
        for (int i = 0; i < maxbox; i++)
        {
            Box b;
            is >> b;
            ba.set(i, b);
        }
        is.ignore(bl_ignore_max, ')');

        if (is.fail()) {
            amrex::Error("readBoxArray(BoxArray&,istream&,int) failed");
        }
    }
}